

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_start(mixed_segment *segment)

{
  void *pvVar1;
  byte local_22;
  byte local_21;
  mixed_channel_t i_1;
  mixed_channel_t i;
  channel_data *data;
  mixed_segment *segment_local;
  
  pvVar1 = segment->data;
  for (local_21 = 0; local_21 < *(byte *)((long)pvVar1 + 0xe0); local_21 = local_21 + 1) {
    if (*(long *)((long)pvVar1 + (ulong)local_21 * 8) == 0) {
      mixed_err(0x16);
      return 0;
    }
  }
  local_22 = 0;
  while( true ) {
    if (*(byte *)((long)pvVar1 + 0xe1) <= local_22) {
      return 1;
    }
    if (*(long *)((long)pvVar1 + (ulong)local_22 * 8 + 0x70) == 0) break;
    local_22 = local_22 + 1;
  }
  mixed_err(0x16);
  return 0;
}

Assistant:

int channel_start(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;
  for(mixed_channel_t i=0; i<data->in_channels; ++i){
    if(data->in[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  for(mixed_channel_t i=0; i<data->out_channels; ++i){
    if(data->out[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}